

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int setup_initial_key(st_quicly_cipher_context_t *ctx,ptls_cipher_suite_t *cs,void *master_secret,
                     char *label,int is_enc,quicly_conn_t *conn)

{
  int iVar1;
  ptls_aead_algorithm_t *in_RCX;
  void *in_RDX;
  long in_RSI;
  ptls_iovec_t pVar2;
  ptls_iovec_t pVar3;
  int ret;
  uint8_t aead_secret [64];
  char *label_00;
  ptls_aead_context_t **aead_ctx;
  ptls_hash_algorithm_t *algo;
  int is_enc_00;
  uint8_t *epoch;
  quicly_conn_t *conn_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  size_t in_stack_ffffffffffffff88;
  ptls_hash_algorithm_t *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  
  label_00 = &stack0xffffffffffffff88;
  aead_ctx = *(ptls_aead_context_t ***)(*(long *)(in_RSI + 0x10) + 8);
  pVar2 = ptls_iovec_init(in_RDX,*(size_t *)(*(long *)(in_RSI + 0x10) + 8));
  epoch = pVar2.base;
  conn_00 = (quicly_conn_t *)pVar2.len;
  pVar3 = ptls_iovec_init((void *)0x0,0);
  algo = (ptls_hash_algorithm_t *)pVar3.base;
  is_enc_00 = pVar3.len._4_4_;
  pVar2.len = (size_t)epoch;
  pVar2.base = (uint8_t *)pVar3.len;
  pVar3.base._4_4_ = in_stack_ffffffffffffff84;
  pVar3.base._0_4_ = in_stack_ffffffffffffff80;
  pVar3.len = in_stack_ffffffffffffff88;
  iVar1 = ptls_hkdf_expand_label
                    (algo,aead_ctx,(size_t)in_RCX,pVar2,label_00,pVar3,
                     (char *)in_stack_ffffffffffffff90);
  if (iVar1 == 0) {
    iVar1 = setup_cipher(conn_00,(size_t)epoch,is_enc_00,(ptls_cipher_context_t **)algo,aead_ctx,
                         in_RCX,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  }
  (*ptls_clear_memory)(&stack0xffffffffffffff88,0x40);
  return iVar1;
}

Assistant:

static int setup_initial_key(struct st_quicly_cipher_context_t *ctx, ptls_cipher_suite_t *cs, const void *master_secret,
                             const char *label, int is_enc, quicly_conn_t *conn)
{
    uint8_t aead_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = ptls_hkdf_expand_label(cs->hash, aead_secret, cs->hash->digest_size,
                                      ptls_iovec_init(master_secret, cs->hash->digest_size), label, ptls_iovec_init(NULL, 0),
                                      NULL)) != 0)
        goto Exit;
    if ((ret = setup_cipher(conn, QUICLY_EPOCH_INITIAL, is_enc, &ctx->header_protection, &ctx->aead, cs->aead, cs->hash,
                            aead_secret)) != 0)
        goto Exit;

Exit:
    ptls_clear_memory(aead_secret, sizeof(aead_secret));
    return ret;
}